

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O2

void cmQtAutoGen::RccListParseContent
               (string *content,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files)

{
  bool bVar1;
  pointer s;
  string qrcEntry;
  string tag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  RegularExpression fileMatchRegex;
  RegularExpression fileReplaceRegex;
  
  cmsys::RegularExpression::RegularExpression(&fileMatchRegex,"(<file[^<]+)");
  cmsys::RegularExpression::RegularExpression(&fileReplaceRegex,"(^<file[^>]*>)");
  s = (content->_M_dataplus)._M_p;
  while( true ) {
    bVar1 = cmsys::RegularExpression::find(&fileMatchRegex,s);
    if (!bVar1) break;
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&qrcEntry,&fileMatchRegex.regmatch,1);
    s = s + qrcEntry._M_string_length;
    cmsys::RegularExpression::find(&fileReplaceRegex,qrcEntry._M_dataplus._M_p);
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&tag,&fileReplaceRegex.regmatch,1);
    std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&qrcEntry);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,&local_1f0
              );
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&tag);
    std::__cxx11::string::~string((string *)&qrcEntry);
  }
  cmsys::RegularExpression::~RegularExpression(&fileReplaceRegex);
  cmsys::RegularExpression::~RegularExpression(&fileMatchRegex);
  return;
}

Assistant:

void cmQtAutoGen::RccListParseContent(std::string const& content,
                                      std::vector<std::string>& files)
{
  cmsys::RegularExpression fileMatchRegex("(<file[^<]+)");
  cmsys::RegularExpression fileReplaceRegex("(^<file[^>]*>)");

  const char* contentChars = content.c_str();
  while (fileMatchRegex.find(contentChars)) {
    std::string const qrcEntry = fileMatchRegex.match(1);
    contentChars += qrcEntry.size();
    {
      fileReplaceRegex.find(qrcEntry);
      std::string const tag = fileReplaceRegex.match(1);
      files.push_back(qrcEntry.substr(tag.size()));
    }
  }
}